

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoreboard.cpp
# Opt level: O0

void __thiscall CScoreboard::RenderNetworkQuality(CScoreboard *this,float x,float w)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  IClient *pIVar4;
  IGraphics *pIVar5;
  ITextRender *pIVar6;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  float in_XMM0_Da;
  float Corners;
  float fVar7;
  int Bar;
  int NumBars;
  float y;
  int Score;
  float LineHeight;
  CUIRect LocalBarRect;
  CUIRect BarRect;
  CQuadItem QuadItem;
  vec4 Color;
  CUIRect RectBox;
  int ScoreThresolds [5];
  float in_stack_ffffffffffffff28;
  float in_stack_ffffffffffffff2c;
  int in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  int in_stack_ffffffffffffff48;
  float in_stack_ffffffffffffff4c;
  CTextCursor *in_stack_ffffffffffffff50;
  vector4_base<float> local_8c;
  float local_7c;
  float fStack_78;
  float local_74;
  float fStack_70;
  float local_6c;
  int in_stack_ffffffffffffff98;
  float in_stack_ffffffffffffff9c;
  float Rounding;
  undefined4 in_stack_ffffffffffffffa0;
  float fVar8;
  float in_stack_ffffffffffffffa4;
  CUIRect *in_stack_ffffffffffffffa8;
  vector4_base<float> local_48;
  undefined4 local_34;
  undefined4 local_2c;
  int local_28 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_34 = 0;
  local_2c = 0x42480000;
  vector4_base<float>::vector4_base(&local_48,0.0,0.0,0.0,0.4);
  pIVar4 = CComponent::Client((CComponent *)0x1bc658);
  iVar2 = (*(pIVar4->super_IInterface)._vptr_IInterface[0x12])();
  pIVar5 = CComponent::Graphics((CComponent *)0x1bc672);
  (*(pIVar5->super_IInterface)._vptr_IInterface[8])();
  CUIRect::Draw(in_stack_ffffffffffffffa8,
                (vec4 *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
  pIVar5 = CComponent::Graphics((CComponent *)0x1bc6a7);
  (*(pIVar5->super_IInterface)._vptr_IInterface[0x13])
            (pIVar5,(ulong)(uint)g_pData->m_aImages[0x15].m_Id.m_Id);
  pIVar5 = CComponent::Graphics((CComponent *)0x1bc6df);
  (*(pIVar5->super_IInterface)._vptr_IInterface[0x17])();
  CComponent::RenderTools((CComponent *)0x1bc6f5);
  CRenderTools::SelectSprite
            ((CRenderTools *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             (int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_ffffffffffffff34,
             in_stack_ffffffffffffff30);
  IGraphics::CQuadItem::CQuadItem
            ((CQuadItem *)&stack0xffffffffffffffa4,in_XMM0_Da + 20.0,12.5,25.0,25.0);
  pIVar5 = CComponent::Graphics((CComponent *)0x1bc740);
  (*(pIVar5->super_IInterface)._vptr_IInterface[0x1d])(pIVar5,&stack0xffffffffffffffa4,1);
  pIVar5 = CComponent::Graphics((CComponent *)0x1bc760);
  (*(pIVar5->super_IInterface)._vptr_IInterface[0x18])();
  if (RenderNetworkQuality(float,float)::s_Cursor == '\0') {
    iVar3 = __cxa_guard_acquire(&RenderNetworkQuality(float,float)::s_Cursor);
    if (iVar3 != 0) {
      CTextCursor::CTextCursor
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
      __cxa_atexit(CTextCursor::~CTextCursor,&RenderNetworkQuality::s_Cursor,&__dso_handle);
      __cxa_guard_release(&RenderNetworkQuality(float,float)::s_Cursor);
    }
  }
  CTextCursor::Reset((CTextCursor *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                     CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CTextCursor::MoveTo((CTextCursor *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                      in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
  pIVar6 = CComponent::TextRender((CComponent *)0x1bc80c);
  (*(pIVar6->super_IInterface)._vptr_IInterface[0xb])
            (pIVar6,&RenderNetworkQuality::s_Cursor,"NET",0xffffffff);
  local_28[0] = 0x7fffffff;
  local_28[1] = 1000;
  local_28[2] = 0xfa;
  local_28[3] = 0x32;
  local_28[4] = 0xffffffb0;
  local_6c = (in_XMM0_Da + 50.0 + 50.0) - 4.0;
  Corners = 17.0;
  Rounding = 6.0;
  fVar8 = 17.0;
  iVar3 = 0;
  while( true ) {
    bVar1 = false;
    if (iVar3 < 5) {
      bVar1 = iVar2 <= local_28[iVar3];
    }
    if (!bVar1) break;
    local_6c = Rounding + 3.0 + local_6c;
    fVar7 = (fVar8 * (float)(iVar3 + 2)) / 5.0 + 1.0;
    _local_74 = CONCAT44(fVar7,Rounding);
    _local_7c = CONCAT44((Corners + fVar8) - fVar7,local_6c);
    vector4_base<float>::vector4_base(&local_8c,0.9,0.9,0.9,1.0);
    CUIRect::Draw(in_stack_ffffffffffffffa8,(vec4 *)CONCAT44(in_stack_ffffffffffffffa4,fVar8),
                  Rounding,(int)Corners);
    iVar3 = iVar3 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CScoreboard::RenderNetworkQuality(float x, float w)
{
	//draw the box
	CUIRect RectBox = {x, 0.0f, w, 50.0f};
	vec4 Color = vec4(0.0f, 0.0f, 0.0f, 0.4f);
	const float LineHeight = 17.0f;
	int Score = Client()->GetInputtimeMarginStabilityScore();

	Graphics()->BlendNormal();
	RectBox.Draw(Color, 15.0f, CUIRect::CORNER_B);
	Graphics()->TextureSet(g_pData->m_aImages[IMAGE_NETWORKICONS].m_Id);
	Graphics()->QuadsBegin();
	RenderTools()->SelectSprite(SPRITE_NETWORK_GOOD);
	IGraphics::CQuadItem QuadItem(x+20.0f, 12.5f, 25.0f, 25.0f);
	Graphics()->QuadsDrawTL(&QuadItem, 1);
	Graphics()->QuadsEnd();

	x += 50.0f;
	static CTextCursor s_Cursor(20.0f);
	s_Cursor.Reset(0);
	s_Cursor.MoveTo(x, 10.0f);
	TextRender()->TextOutlined(&s_Cursor, "NET", -1);
	x += 50.0f;
	float y = 0.0f;

	const int NumBars = 5;
	int ScoreThresolds[NumBars] = {INT_MAX, 1000, 250, 50, -80};
	CUIRect BarRect = {
		x - 4.0f,
		y + LineHeight,
		6.0f,
		LineHeight
	};

	for(int Bar = 0; Bar < NumBars && Score <= ScoreThresolds[Bar]; Bar++)
	{
		BarRect.x += BarRect.w + 3.0f;
		CUIRect LocalBarRect = BarRect;
		LocalBarRect.h = BarRect.h*(Bar+2)/(float)NumBars+1.0f;
		LocalBarRect.y = BarRect.y + BarRect.h - LocalBarRect.h;
		LocalBarRect.Draw(vec4(0.9f,0.9f,0.9f,1.0f), 0.0f, CUIRect::CORNER_NONE);
	}
}